

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Designator_PDU::Encode(Designator_PDU *this,KDataStream *stream)

{
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_DesignatingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase
    [5])(&this->m_DesignatingEntityID,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16CodeName);
  (*(this->m_DesignatedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5]
  )(&this->m_DesignatedEntityID,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Code);
  KDataStream::Write<float>(stream,(float)this->m_f32Power);
  KDataStream::Write<float>(stream,(float)this->m_f32WaveLength);
  (*(this->m_SpotRegardsToEntity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_SpotRegardsToEntity,stream);
  (*(this->m_SpotLocation).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_SpotLocation,stream);
  KDataStream::Write(stream,this->m_ui8DeadReckoningAlgorithm);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  KDataStream::Write(stream,this->m_ui8Padding2);
  (*(this->m_EntityLinearAcceleration).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EntityLinearAcceleration,stream);
  return;
}

Assistant:

void Designator_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_DesignatingEntityID
           << m_ui16CodeName
           << KDIS_STREAM m_DesignatedEntityID
           << m_ui16Code
           << m_f32Power
           << m_f32WaveLength
           << KDIS_STREAM m_SpotRegardsToEntity
           << KDIS_STREAM m_SpotLocation
           << m_ui8DeadReckoningAlgorithm
           << m_ui16Padding1
           << m_ui8Padding2
           << KDIS_STREAM m_EntityLinearAcceleration;
}